

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> * Vector<unsigned_int>(uint *args)

{
  long lVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  long in_FS_OFFSET;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *ret;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__args;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffb8;
  size_type in_stack_ffffffffffffffd0;
  undefined7 in_stack_ffffffffffffffd8;
  undefined1 uVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0;
  __args = in_RDI;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(in_stack_ffffffffffffff98);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT17(uVar2,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (in_stack_ffffffffffffffb8,(uint *)__args);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

inline std::vector<typename std::common_type<Args...>::type> Vector(Args&&... args)
{
    std::vector<typename std::common_type<Args...>::type> ret;
    ret.reserve(sizeof...(args));
    // The line below uses the trick from https://www.experts-exchange.com/articles/32502/None-recursive-variadic-templates-with-std-initializer-list.html
    (void)std::initializer_list<int>{(ret.emplace_back(std::forward<Args>(args)), 0)...};
    return ret;
}